

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O2

void __thiscall
spdlog::details::circular_q<spdlog::details::async_msg>::circular_q
          (circular_q<spdlog::details::async_msg> *this,size_t max_items)

{
  allocator_type local_1;
  
  this->max_items_ = max_items + 1;
  this->head_ = 0;
  this->tail_ = 0;
  this->overrun_counter_ = 0;
  std::vector<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>::vector
            (&this->v_,max_items + 1,&local_1);
  return;
}

Assistant:

explicit circular_q(size_t max_items)
        : max_items_(max_items + 1)  // one item is reserved as marker for full q
          ,
          v_(max_items_) {}